

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O1

int Ssw_ManProfileConstraints(Aig_Man_t *p,int nWords,int nFrames,int fVerbose)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  long lVar7;
  void **ppvVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  undefined8 *__ptr;
  void *__s;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  undefined8 *puVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  void *pvVar23;
  ulong uVar24;
  float fVar25;
  timespec ts;
  int local_90;
  timespec local_50;
  long local_40;
  void **local_38;
  
  uVar14 = (ulong)(uint)nWords;
  iVar12 = clock_gettime(3,&local_50);
  if (iVar12 < 0) {
    lVar17 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (fVerbose != 0) {
    printf("Simulating %d nodes and %d flops for %d frames with %d words... ",
           (ulong)(uint)(p->nObjs[6] + p->nObjs[5]),(ulong)(uint)p->nRegs,(ulong)(uint)nFrames,
           uVar14);
  }
  Aig_ManRandom(1);
  iVar12 = p->vObjs->nSize;
  lVar20 = (long)iVar12;
  uVar24 = lVar20 + 2;
  __ptr = (undefined8 *)malloc(((long)nWords * 4 + 8) * uVar24);
  if (-2 < lVar20) {
    pvVar23 = __ptr + lVar20 + 2;
    uVar16 = uVar24 & 0xffffffff;
    puVar18 = __ptr;
    do {
      *puVar18 = pvVar23;
      puVar18 = puVar18 + 1;
      pvVar23 = (void *)((long)pvVar23 + (long)nWords * 4);
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
    if (-2 < iVar12) {
      uVar16 = 0;
      do {
        memset((void *)__ptr[uVar16],0,(long)(nWords * 4));
        uVar16 = uVar16 + 1;
      } while (uVar24 != uVar16);
    }
  }
  uVar2 = p->nTruePos;
  lVar20 = (long)(int)uVar2;
  uVar13 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar13 = uVar2;
  }
  if (uVar13 == 0) {
    pvVar23 = (void *)0x0;
  }
  else {
    pvVar23 = malloc((long)(int)uVar13 * 4);
  }
  if (pvVar23 != (void *)0x0) {
    memset(pvVar23,0,lVar20 * 4);
  }
  if (uVar13 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar13 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,lVar20 * 4);
  }
  iVar12 = p->pConst1->Id;
  if ((-1 < (long)iVar12) && (local_90 = (int)uVar24, iVar12 < local_90)) {
    local_40 = lVar17;
    if (0 < nWords) {
      memset((void *)__ptr[iVar12],0xff,uVar14 * 4);
    }
    if (0 < p->nRegs) {
      pVVar5 = p->vCos;
      iVar12 = 0;
      do {
        uVar13 = p->nTruePos + iVar12;
        if (((int)uVar13 < 0) || (pVVar5->nSize <= (int)uVar13)) goto LAB_006d8bba;
        iVar15 = *(int *)((long)pVVar5->pArray[uVar13] + 0x24);
        if (((long)iVar15 < 0) || (local_90 <= iVar15)) goto LAB_006d8bba;
        if (0 < nWords) {
          memset((void *)__ptr[iVar15],0,uVar14 * 4);
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 < p->nRegs);
    }
    iVar12 = p->vObjs->nSize;
    if (((-1 < (long)iVar12) && (iVar12 < local_90)) && ((int)(iVar12 + 1U) < local_90)) {
      if (0 < nFrames) {
        lVar17 = __ptr[iVar12];
        lVar6 = __ptr[iVar12 + 1U];
        iVar12 = 0;
        do {
          if (0 < p->nTruePis) {
            lVar21 = 0;
            do {
              if (p->vCis->nSize <= lVar21) goto LAB_006d8bba;
              iVar15 = *(int *)((long)p->vCis->pArray[lVar21] + 0x24);
              if (((long)iVar15 < 0) || (local_90 <= iVar15)) goto LAB_006d8bba;
              if (0 < nWords) {
                lVar7 = __ptr[iVar15];
                uVar24 = 0;
                do {
                  uVar13 = Aig_ManRandom(0);
                  *(uint *)(lVar7 + uVar24 * 4) = uVar13;
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 < p->nTruePis);
          }
          if (0 < p->nRegs) {
            pVVar5 = p->vCos;
            iVar15 = 0;
            do {
              uVar13 = p->nTruePos + iVar15;
              if ((((int)uVar13 < 0) || (pVVar5->nSize <= (int)uVar13)) ||
                 ((uVar22 = p->nTruePis + iVar15, (int)uVar22 < 0 || (p->vCis->nSize <= (int)uVar22)
                  ))) goto LAB_006d8bba;
              iVar3 = *(int *)((long)p->vCis->pArray[uVar22] + 0x24);
              if (((long)iVar3 < 0) || (local_90 <= iVar3)) goto LAB_006d8bba;
              iVar4 = *(int *)((long)pVVar5->pArray[uVar13] + 0x24);
              if (((long)iVar4 < 0) || (local_90 <= iVar4)) goto LAB_006d8bba;
              if (0 < nWords) {
                lVar21 = __ptr[iVar3];
                lVar7 = __ptr[iVar4];
                uVar24 = 0;
                do {
                  *(undefined4 *)(lVar21 + uVar24 * 4) = *(undefined4 *)(lVar7 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              iVar15 = iVar15 + 1;
            } while (iVar15 < p->nRegs);
          }
          pVVar5 = p->vObjs;
          if (0 < pVVar5->nSize) {
            ppvVar8 = pVVar5->pArray;
            lVar21 = 0;
            do {
              pvVar9 = ppvVar8[lVar21];
              if ((pvVar9 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar9 + 0x18) & 7) - 7)
                 ) {
                iVar15 = *(int *)((long)pvVar9 + 0x24);
                if (((long)iVar15 < 0) || (local_90 <= iVar15)) goto LAB_006d8bba;
                uVar24 = *(ulong *)((long)pvVar9 + 8);
                if (uVar24 == 0) {
                  uVar13 = 0xffffffff;
                }
                else {
                  uVar13 = *(uint *)((uVar24 & 0xfffffffffffffffe) + 0x24);
                }
                if (((int)uVar13 < 0) || (local_90 <= (int)uVar13)) goto LAB_006d8bba;
                uVar16 = *(ulong *)((long)pvVar9 + 0x10);
                if (uVar16 == 0) {
                  uVar22 = 0xffffffff;
                }
                else {
                  uVar22 = *(uint *)((uVar16 & 0xfffffffffffffffe) + 0x24);
                }
                if (((int)uVar22 < 0) || (local_90 <= (int)uVar22)) goto LAB_006d8bba;
                lVar7 = __ptr[iVar15];
                lVar11 = __ptr[uVar13];
                lVar10 = __ptr[uVar22];
                if ((uVar24 & 1) == 0) {
                  if ((uVar16 & 1) == 0) {
                    if (0 < nWords) {
                      uVar24 = 0;
                      do {
                        *(uint *)(lVar7 + uVar24 * 4) =
                             *(uint *)(lVar10 + uVar24 * 4) & *(uint *)(lVar11 + uVar24 * 4);
                        uVar24 = uVar24 + 1;
                      } while (uVar14 != uVar24);
                    }
                  }
                  else if (0 < nWords) {
                    uVar24 = 0;
                    do {
                      *(uint *)(lVar7 + uVar24 * 4) =
                           ~*(uint *)(lVar10 + uVar24 * 4) & *(uint *)(lVar11 + uVar24 * 4);
                      uVar24 = uVar24 + 1;
                    } while (uVar14 != uVar24);
                  }
                }
                else if ((uVar16 & 1) == 0) {
                  if (0 < nWords) {
                    uVar24 = 0;
                    do {
                      *(uint *)(lVar7 + uVar24 * 4) =
                           ~*(uint *)(lVar11 + uVar24 * 4) & *(uint *)(lVar10 + uVar24 * 4);
                      uVar24 = uVar24 + 1;
                    } while (uVar14 != uVar24);
                  }
                }
                else if (0 < nWords) {
                  uVar24 = 0;
                  do {
                    *(uint *)(lVar7 + uVar24 * 4) =
                         ~(*(uint *)(lVar10 + uVar24 * 4) | *(uint *)(lVar11 + uVar24 * 4));
                    uVar24 = uVar24 + 1;
                  } while (uVar14 != uVar24);
                }
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 < pVVar5->nSize);
          }
          if (0 < nWords) {
            uVar24 = 0;
            do {
              *(undefined4 *)(lVar6 + uVar24 * 4) = 0;
              *(undefined4 *)(lVar17 + uVar24 * 4) = 0;
              uVar24 = uVar24 + 1;
            } while (uVar14 != uVar24);
          }
          pVVar5 = p->vCos;
          if (0 < pVVar5->nSize) {
            local_38 = pVVar5->pArray;
            lVar21 = 0;
            do {
              iVar15 = *(int *)((long)local_38[lVar21] + 0x24);
              if (((long)iVar15 < 0) || (local_90 <= iVar15)) goto LAB_006d8bba;
              uVar24 = *(ulong *)((long)local_38[lVar21] + 8);
              if (uVar24 == 0) {
                uVar13 = 0xffffffff;
              }
              else {
                uVar13 = *(uint *)((uVar24 & 0xfffffffffffffffe) + 0x24);
              }
              if (((int)uVar13 < 0) || (local_90 <= (int)uVar13)) goto LAB_006d8bba;
              lVar7 = __ptr[iVar15];
              lVar11 = __ptr[uVar13];
              if ((lVar21 < p->nTruePos) && ((long)p->nTruePos - (long)p->nConstrs <= lVar21)) {
                if ((uVar24 & 1) == 0) {
                  if (0 < nWords) {
                    uVar24 = 0;
                    do {
                      puVar1 = (uint *)(lVar7 + uVar24 * 4);
                      *puVar1 = *puVar1 | *(uint *)(lVar11 + uVar24 * 4);
                      uVar24 = uVar24 + 1;
                    } while (uVar14 != uVar24);
                  }
                }
                else if (0 < nWords) {
                  uVar24 = 0;
                  do {
                    puVar1 = (uint *)(lVar7 + uVar24 * 4);
                    *puVar1 = *puVar1 | ~*(uint *)(lVar11 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar14 != uVar24);
                }
              }
              else if ((uVar24 & 1) == 0) {
                if (0 < nWords) {
                  uVar24 = 0;
                  do {
                    *(undefined4 *)(lVar7 + uVar24 * 4) = *(undefined4 *)(lVar11 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar14 != uVar24);
                }
              }
              else if (0 < nWords) {
                uVar24 = 0;
                do {
                  *(uint *)(lVar7 + uVar24 * 4) = ~*(uint *)(lVar11 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              if (lVar21 < (long)p->nTruePos - (long)p->nConstrs) {
                if (0 < nWords) {
                  uVar24 = 0;
                  do {
                    puVar1 = (uint *)(lVar17 + uVar24 * 4);
                    *puVar1 = *puVar1 | *(uint *)(lVar7 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar14 != uVar24);
                }
              }
              else if (lVar21 < p->nTruePos && 0 < nWords) {
                uVar24 = 0;
                do {
                  puVar1 = (uint *)(lVar6 + uVar24 * 4);
                  *puVar1 = *puVar1 | *(uint *)(lVar7 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 < pVVar5->nSize);
          }
          uVar24 = (ulong)(uint)p->nTruePos;
          if (0 < p->nTruePos) {
            uVar16 = 0;
            do {
              if ((long)p->vCos->nSize <= (long)uVar16) goto LAB_006d8bba;
              iVar15 = *(int *)((long)p->vCos->pArray[uVar16] + 0x24);
              if (((long)iVar15 < 0) || (local_90 <= iVar15)) goto LAB_006d8bba;
              lVar21 = __ptr[iVar15];
              if (0 < nWords) {
                if (lVar20 <= (long)uVar16) goto LAB_006d8bd9;
                iVar15 = *(int *)((long)pvVar23 + uVar16 * 4);
                uVar19 = 0;
                do {
                  uVar13 = *(uint *)(lVar21 + uVar19 * 4);
                  uVar13 = (uVar13 & 0x55555555) + (uVar13 >> 1 & 0x55555555);
                  uVar13 = (uVar13 & 0x33333333) + (uVar13 >> 2 & 0x33333333);
                  uVar13 = (uVar13 & 0x7070707) + (uVar13 >> 4 & 0x7070707);
                  uVar13 = (uVar13 & 0xf000f) + (uVar13 >> 8 & 0xf000f);
                  iVar15 = (uVar13 >> 0x10) + iVar15 + (uVar13 & 0xffff);
                  *(int *)((long)pvVar23 + uVar16 * 4) = iVar15;
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              if ((long)uVar16 < (long)(int)uVar24 - (long)p->nConstrs) {
                uVar19 = 0;
                uVar24 = uVar19;
                if (0 < nWords) {
                  do {
                    uVar24 = uVar19;
                    if ((*(uint *)(lVar21 + uVar19 * 4) & ~*(uint *)(lVar6 + uVar19 * 4)) != 0)
                    break;
                    uVar19 = uVar19 + 1;
                    uVar24 = uVar14;
                  } while (uVar14 != uVar19);
                }
                if ((int)uVar24 != nWords) {
                  printf("Primary output %d fails on some input patterns.\n",uVar16 & 0xffffffff);
                }
              }
              else if (0 < nWords) {
                if (lVar20 <= (long)uVar16) {
LAB_006d8bd9:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
                }
                iVar15 = *(int *)((long)__s + uVar16 * 4);
                uVar24 = 0;
                do {
                  uVar13 = *(uint *)(lVar17 + uVar24 * 4) & *(uint *)(lVar21 + uVar24 * 4);
                  uVar13 = (uVar13 & 0x55555555) + (uVar13 >> 1 & 0x55555555);
                  uVar13 = (uVar13 & 0x33333333) + (uVar13 >> 2 & 0x33333333);
                  uVar13 = (uVar13 & 0x7070707) + (uVar13 >> 4 & 0x7070707);
                  uVar13 = (uVar13 & 0xf000f) + (uVar13 >> 8 & 0xf000f);
                  iVar15 = (uVar13 >> 0x10) + iVar15 + (uVar13 & 0xffff);
                  *(int *)((long)__s + uVar16 * 4) = iVar15;
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              uVar16 = uVar16 + 1;
              uVar24 = (ulong)p->nTruePos;
            } while ((long)uVar16 < (long)uVar24);
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 != nFrames);
      }
      if (fVerbose != 0) {
        iVar15 = 3;
        iVar12 = clock_gettime(3,&local_50);
        if (iVar12 < 0) {
          lVar17 = -1;
        }
        else {
          lVar17 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
        }
        lVar17 = lVar17 + local_40;
        Abc_Print(iVar15,"%s =","T");
        Abc_Print(iVar15,"%9.2f sec\n",(double)lVar17 / 1000000.0);
        uVar14 = (ulong)(uint)p->nTruePos;
        if (0 < p->nTruePos) {
          fVar25 = (float)(nWords * nFrames * 0x20);
          uVar24 = (ulong)uVar2;
          if ((int)uVar2 < 1) {
            uVar24 = 0;
          }
          uVar16 = 0;
          do {
            if ((long)p->vCos->nSize <= (long)uVar16) goto LAB_006d8bba;
            pvVar9 = p->vCos->pArray[uVar16];
            if ((long)uVar16 < (long)((int)uVar14 - p->nConstrs)) {
              printf("Primary output :  ");
            }
            else {
              printf("Constraint %3d :  ",(ulong)(uint)((p->nConstrs - (int)uVar14) + (int)uVar16));
            }
            if (uVar24 == uVar16) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            printf("ProbOne = %f  ",(double)((float)*(int *)((long)pvVar23 + uVar16 * 4) / fVar25));
            printf("ProbOneC = %f  ",(double)((float)*(int *)((long)__s + uVar16 * 4) / fVar25));
            printf("AllZeroValue = %d ",(ulong)(*(uint *)((long)pvVar9 + 0x18) >> 3 & 1));
            putchar(10);
            uVar16 = uVar16 + 1;
            uVar14 = (ulong)p->nTruePos;
          } while ((long)uVar16 < (long)uVar14);
        }
      }
      if (__ptr != (undefined8 *)0x0) {
        free(__ptr);
      }
      if (pvVar23 != (void *)0x0) {
        free(pvVar23);
      }
      if (__s != (void *)0x0) {
        free(__s);
      }
      return 1;
    }
  }
LAB_006d8bba:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Ssw_ManProfileConstraints( Aig_Man_t * p, int nWords, int nFrames, int fVerbose )
{
    Vec_Ptr_t * vInfo;
    Vec_Int_t * vProbs, * vProbs2;
    Aig_Obj_t * pObj, * pObjLi;
    unsigned * pInfo, * pInfo0, * pInfo1, * pInfoMask, * pInfoMask2;
    int i, w, f, RetValue = 1;
    abctime clk = Abc_Clock();
    if ( fVerbose )
        printf( "Simulating %d nodes and %d flops for %d frames with %d words... ", 
            Aig_ManNodeNum(p), Aig_ManRegNum(p), nFrames, nWords );
    Aig_ManRandom( 1 );
    vInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p)+2, nWords );
    Vec_PtrCleanSimInfo( vInfo, 0, nWords );
    vProbs  = Vec_IntStart( Saig_ManPoNum(p) );
    vProbs2 = Vec_IntStart( Saig_ManPoNum(p) );
    // start the constant
    pInfo = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(Aig_ManConst1(p)) );
    for ( w = 0; w < nWords; w++ )
        pInfo[w] = ~0;
    // start the flop inputs
    Saig_ManForEachLi( p, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = 0;
    }
    // get the info mask
    pInfoMask  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ManObjNumMax(p) );    // PO failed
    pInfoMask2 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ManObjNumMax(p)+1 );  // constr failed
    for ( f = 0; f < nFrames; f++ )
    {
        // assign primary inputs
        Saig_ManForEachPi( p, pObj, i )
        {
            pInfo = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            for ( w = 0; w < nWords; w++ )
                pInfo[w] = Aig_ManRandom( 0 );
        }
        // move the flop values
        Saig_ManForEachLiLo( p, pObjLi, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObjLi) );
            for ( w = 0; w < nWords; w++ )
                pInfo[w] = pInfo0[w];
        }
        // simulate the nodes
        Aig_ManForEachNode( p, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjFaninId0(pObj) );
            pInfo1 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjFaninId1(pObj) );
            if ( Aig_ObjFaninC0(pObj) )
            {
                if (  Aig_ObjFaninC1(pObj) )
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = ~(pInfo0[w] | pInfo1[w]);
                else 
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = ~pInfo0[w] & pInfo1[w];
            }
            else 
            {
                if (  Aig_ObjFaninC1(pObj) )
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = pInfo0[w] & ~pInfo1[w];
                else 
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = pInfo0[w] & pInfo1[w];
            }
        }
        // clean the mask
        for ( w = 0; w < nWords; w++ )
            pInfoMask[w] = pInfoMask2[w] = 0;
        // simulate the primary outputs
        Aig_ManForEachCo( p, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjFaninId0(pObj) );
            if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) || i >= Saig_ManPoNum(p) )
            {
                if ( Aig_ObjFaninC0(pObj) )
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = ~pInfo0[w];
                }
                else 
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = pInfo0[w];
                }
            }
            else
            {
                if ( Aig_ObjFaninC0(pObj) )
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] |= ~pInfo0[w];
                }
                else 
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] |= pInfo0[w];
                }
            }
            // collect patterns when one of the outputs fails
            if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) )
            {
                for ( w = 0; w < nWords; w++ )
                    pInfoMask[w] |= pInfo[w];
            }
            else if ( i < Saig_ManPoNum(p) )
            {
                for ( w = 0; w < nWords; w++ )
                    pInfoMask2[w] |= pInfo[w];
            }
        }
        // compare the PO values (mask=1 => out=0) or UNSAT(mask=1 & out=1)
        Saig_ManForEachPo( p, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            for ( w = 0; w < nWords; w++ )
                Vec_IntAddToEntry( vProbs, i, Aig_WordCountOnes(pInfo[w]) );
            if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) )
            {
                // chek the output
                for ( w = 0; w < nWords; w++ )
                    if ( pInfo[w] & ~pInfoMask2[w] ) 
                        break;
                if ( w == nWords )
                    continue;
                printf( "Primary output %d fails on some input patterns.\n", i );
            }
            else
            {
                // collect patterns that block the POs
                for ( w = 0; w < nWords; w++ )
                    Vec_IntAddToEntry( vProbs2, i, Aig_WordCountOnes(pInfo[w] & pInfoMask[w]) );
            }
        }
    }
    if ( fVerbose )
        Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    // print the state
    if ( fVerbose )
    {
        Saig_ManForEachPo( p, pObj, i )
        {
            if ( i < Saig_ManPoNum(p) - Saig_ManConstrNum(p) )
                printf( "Primary output :  " );
            else
                printf( "Constraint %3d :  ", i-(Saig_ManPoNum(p) - Saig_ManConstrNum(p))  );
            printf( "ProbOne = %f  ",  (float)Vec_IntEntry(vProbs,  i)/(32*nWords*nFrames) );
            printf( "ProbOneC = %f  ", (float)Vec_IntEntry(vProbs2, i)/(32*nWords*nFrames) );
            printf( "AllZeroValue = %d ", Aig_ObjPhase(pObj) );
            printf( "\n" );
        }
    }

    // print the states
    Vec_PtrFree( vInfo );
    Vec_IntFree( vProbs );
    Vec_IntFree( vProbs2 );
    return RetValue;
}